

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O1

void __thiscall orphanage_tests::get_children::test_method(get_children *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  readonly_property<bool> rVar4;
  long lVar5;
  iterator in_R8;
  iterator pvVar6;
  allocator_type *__a;
  assertion_result *paVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  const_string file_17;
  const_string file_18;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_06;
  const_string file_19;
  const_string file_20;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  const_string file_21;
  const_string file_22;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_08;
  const_string file_23;
  const_string file_24;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  CTransactionRef child_p1n0_p2n0;
  CTransactionRef child_p1n0_p1n1;
  CTransactionRef child_p2n1;
  CTransactionRef child_p1n0;
  CTransactionRef parent1;
  vector<COutPoint,_std::allocator<COutPoint>_> empty_outpoints;
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  expected_parent2_children;
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  expected_parent1_children;
  TxOrphanage orphanage;
  FastRandomContext det_rand;
  check_type cVar13;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [24];
  assertion_result local_370;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  CTransactionRef local_278;
  CTransactionRef local_268;
  CTransactionRef local_258;
  CTransactionRef local_248;
  CTransactionRef local_238;
  CTransactionRef local_228;
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [9];
  undefined1 auStack_1ef [7];
  shared_count sStack_1e8;
  element_type *local_1e0;
  undefined1 local_1d8 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_1d0;
  element_type *local_1c0;
  element_type *local_1b8;
  element_type *local_1b0;
  undefined1 local_1a8 [16];
  pointer local_198;
  _Base_ptr local_190;
  undefined1 local_178 [8];
  _Rb_tree_node_base _Stack_170;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  _Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
  _Stack_148;
  undefined1 local_118 [48];
  pointer p_Stack_e8;
  undefined1 local_e0 [16];
  NodeSeconds local_d0;
  FastRandomContext local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&local_c0,true);
  local_218 = (undefined1  [16])0x0;
  local_208 = (pointer)0x0;
  MakeTransactionSpending
            ((orphanage_tests *)&local_228,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_218,&local_c0);
  MakeTransactionSpending
            ((orphanage_tests *)&local_238,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_218,&local_c0);
  auVar11[0] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar11[1] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar11[2] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar11[3] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar11[4] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar11[5] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar11[6] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar11[7] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar11[8] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar11[9] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar11[10] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar11[0xb] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar11[0xc] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar11[0xd] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar11[0xe] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar11[0xf] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar9[0] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar9[1] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar9[2] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar9[3] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar9[4] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar9[5] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar9[6] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar9[7] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar9[8] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar9[9] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
               ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar9[10] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar9[0xb] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar9[0xc] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar9[0xd] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar9[0xe] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar9[0xf] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar9 = auVar9 & auVar11;
  if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
    do {
      MakeTransactionSpending
                ((orphanage_tests *)local_178,
                 (vector<COutPoint,_std::allocator<COutPoint>_> *)local_218,&local_c0);
      this_00._M_pi =
           local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_178;
      local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_170._0_8_;
      _local_178 = (undefined1  [16])0x0;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_170._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_170._0_8_);
      }
      auVar12[0] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
      auVar12[1] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
      auVar12[2] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
      auVar12[3] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
      auVar12[4] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
      auVar12[5] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
      auVar12[6] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
      auVar12[7] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
      auVar12[8] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
      auVar12[9] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
      auVar12[10] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                     ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
      auVar12[0xb] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar12[0xc] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar12[0xd] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar12[0xe] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar12[0xf] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar10[0] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar10[1] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar10[2] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar10[3] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar10[4] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar10[5] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar10[6] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar10[7] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar10[8] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar10[9] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                    ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar10[10] = -(((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar10[0xb] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar10[0xc] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar10[0xd] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar10[0xe] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar10[0xf] = -(((local_238.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar10 = auVar10 & auVar12;
    } while ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
  }
  _local_178 = *(undefined1 (*) [16])
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  _Stack_170._M_parent =
       *(_Base_ptr *)
        (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  _Stack_170._M_left =
       *(_Base_ptr *)
        (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  _Stack_170._M_right._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_178;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,__l,
             (allocator_type *)local_1d8);
  MakeTransactionSpending
            ((orphanage_tests *)&local_248,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,&local_c0);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
  }
  _local_178 = *(undefined1 (*) [16])
                ((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  _Stack_170._M_parent =
       *(_Base_ptr *)
        (((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  _Stack_170._M_left =
       *(_Base_ptr *)
        (((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  _Stack_170._M_right._0_4_ = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_178;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,__l_00,
             (allocator_type *)local_1d8);
  MakeTransactionSpending
            ((orphanage_tests *)&local_258,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,&local_c0);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
  }
  _local_178 = *(undefined1 (*) [16])
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  _Stack_170._M_parent =
       *(_Base_ptr *)
        (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  _Stack_170._M_left =
       *(_Base_ptr *)
        (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  _Stack_170._M_right._0_4_ = 0;
  uVar1 = *(undefined8 *)
           ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar2 = *(undefined8 *)
           (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  _Stack_148._M_impl._4_8_ =
       *(undefined8 *)
        (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar3 = *(undefined8 *)
           (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  _Stack_170._M_right._4_4_ = (undefined4)uVar1;
  uStack_150 = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_14c = (undefined4)uVar2;
  _Stack_148._M_impl._0_4_ = SUB84((ulong)uVar2 >> 0x20,0);
  _Stack_148._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar3,0);
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar3 >> 0x20);
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 1;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_178;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,__l_01,
             (allocator_type *)local_1d8);
  MakeTransactionSpending
            ((orphanage_tests *)&local_268,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,&local_c0);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
  }
  _local_178 = *(undefined1 (*) [16])
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  _Stack_170._M_parent =
       *(_Base_ptr *)
        (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  _Stack_170._M_left =
       *(_Base_ptr *)
        (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  _Stack_170._M_right._0_4_ = 0;
  uVar1 = *(undefined8 *)
           ((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar2 = *(undefined8 *)
           (((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  _Stack_148._M_impl._4_8_ =
       *(undefined8 *)
        (((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar3 = *(undefined8 *)
           (((local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  _Stack_170._M_right._4_4_ = (undefined4)uVar1;
  uStack_150 = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_14c = (undefined4)uVar2;
  _Stack_148._M_impl._0_4_ = SUB84((ulong)uVar2 >> 0x20,0);
  _Stack_148._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar3,0);
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar3 >> 0x20);
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_178;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,__l_02,
             (allocator_type *)local_1d8);
  MakeTransactionSpending
            ((orphanage_tests *)&local_278,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_1a8,&local_c0);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
  }
  _Stack_170._M_left = (_Base_ptr)(local_178 + 8);
  _Stack_170._M_color = 0;
  _Stack_170._M_parent = (_Base_ptr)0x0;
  uStack_150 = 0;
  uStack_14c = 0;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_148._M_impl.super__Rb_tree_header._M_header;
  _Stack_148._M_impl._4_8_ = _Stack_148._M_impl._4_8_ & 0xffffffff;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  _Stack_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._24_8_ = local_118 + 8;
  local_118._8_4_ = _S_red;
  local_118._16_8_ = (_Base_ptr)0x0;
  stack0xffffffffffffff10 = (undefined1  [16])0x0;
  local_e0 = (undefined1  [16])0x0;
  local_d0.__d.__r = (duration)0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x12e;
  file.m_begin = (iterator)&local_288;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_148._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118._32_8_ = local_118._24_8_;
  _Stack_170._M_right = _Stack_170._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_248,1);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0, node1)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee566e;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  local_1d8[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_2a8,0x12e);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12f;
  file_00.m_begin = (iterator)&local_2b8;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c8,
             msg_00);
  local_1d8[0] = (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_258,1);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p2n1, node1)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee5691;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2d0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_2d8,0x12f);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x130;
  file_01.m_begin = (iterator)&local_2e8;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2f8,
             msg_01);
  local_1d8[0] = (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_268,1);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p1n1, node1)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee56b9;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_300 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_308,0x130);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x131;
  file_02.m_begin = (iterator)&local_318;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_328,
             msg_02);
  local_1d8[0] = (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_278,1);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p2n0, node1)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(element_type *)0xee56e1
  ;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_330 = "";
  pvVar6 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_338,0x131);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_1d8 = (undefined1  [8])
              local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_1c0 = (element_type *)
              local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if ((element_type *)
      local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_1b8 = local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1b0 = (element_type *)
              local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if ((element_type *)
      local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_1d8;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)local_1a8,__l_03,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)&local_370);
  lVar5 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_1e0 + lVar5) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_1e0 + lVar5));
    }
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != 0);
  local_1f8._0_8_ =
       local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((element_type *)
      local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  sStack_1e8.pi_ =
       (sp_counted_base *)
       local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  stack0xfffffffffffffe10 =
       local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_1e0 = (element_type *)
              local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if ((element_type *)
      local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  __a = (allocator_type *)local_388;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_1f8;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)local_1d8,__l_04,(less<std::shared_ptr<const_CTransaction>_> *)&local_370,__a);
  lVar5 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_200 + lVar5) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_200 + lVar5));
    }
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != 0);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x136;
  file_03.m_begin = (iterator)&local_348;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = (iterator)__a;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_358,
             msg_03);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_228,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ =
       "EqualTxns(expected_parent1_children, orphanage.GetChildrenFromSamePeer(parent1, node1))";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(_auStack_1ef << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_3a8,0x136);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x137;
  file_04.m_begin = (iterator)&local_3b8;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3c8,
             msg_04);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_238,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1d8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ =
       "EqualTxns(expected_parent2_children, orphanage.GetChildrenFromSamePeer(parent2, node1))";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3d0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_3d8,0x137);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x139;
  file_05.m_begin = (iterator)&local_3e8;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3f8,
             msg_05);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_228,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1a8,
                 (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ =
       "EqualTxns(expected_parent1_children, orphanage.GetChildrenFromDifferentPeer(parent1, node2))"
  ;
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_400 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_408,0x139);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x13a;
  file_06.m_begin = (iterator)&local_418;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_428,
             msg_06);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_238,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1d8,
                 (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                  *)local_388);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ =
       "EqualTxns(expected_parent2_children, orphanage.GetChildrenFromDifferentPeer(parent2, node2))"
  ;
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_430 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_438,0x13a);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x13d;
  file_07.m_begin = (iterator)&local_448;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_458,
             msg_07);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_228,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ = "orphanage.GetChildrenFromSamePeer(parent1, node2).empty()";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_460 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_468,0x13d);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x13e;
  file_08.m_begin = (iterator)&local_478;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_488,
             msg_08);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_238,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ = "orphanage.GetChildrenFromSamePeer(parent2, node2).empty()";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_490 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_498,0x13e);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x141;
  file_09.m_begin = (iterator)&local_4a8;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4b8,
             msg_09);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_278,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ = "orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node1).empty()";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4c0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_4c8,0x141);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x142;
  file_10.m_begin = (iterator)&local_4d8;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4e8,
             msg_10);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_278,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ = "orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node2).empty()";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4f0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_4f8,0x142);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_388);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x143;
  file_11.m_begin = (iterator)&local_508;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_518,
             msg_11);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_278,1);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ = "orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node1).empty()";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_520 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_528,0x143);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x144;
  file_12.m_begin = (iterator)&local_538;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_548,
             msg_12);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)local_388,(TxOrphanage *)local_178,&local_278,2);
  local_370.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_388._0_8_ == local_388._8_8_);
  local_370.m_message.px = (element_type *)0x0;
  local_370.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_398._0_8_ = "orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node2).empty()";
  local_398._8_8_ = "";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._9_8_ << 8);
  local_1f8._0_8_ = &PTR__lazy_ostream_013d3df0;
  sStack_1e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_550 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1e0 = (element_type *)local_398;
  boost::test_tools::tt_detail::report_assertion
            (&local_370,(lazy_ostream *)local_1f8,1,0,WARN,_cVar13,(size_t)&local_558,0x144);
  boost::detail::shared_count::~shared_count(&local_370.m_message.pn);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)local_388);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_1d8);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_1a8);
  if (p_Stack_e8 != (pointer)0x0) {
    operator_delete(p_Stack_e8,local_e0._8_8_ - (long)p_Stack_e8);
  }
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
               *)local_118);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
  ::~_Rb_tree(&_Stack_148);
  std::
  _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
  ::~_Rb_tree((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
               *)local_178);
  _Stack_170._M_color = 0;
  _Stack_170._M_parent = (_Base_ptr)0x0;
  _Stack_170._M_left = (_Base_ptr)(local_178 + 8);
  uStack_150 = 0;
  uStack_14c = 0;
  _Stack_148._M_impl._4_8_ = _Stack_148._M_impl._4_8_ & 0xffffffff;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_148._M_impl.super__Rb_tree_header._M_header;
  _Stack_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._8_4_ = _S_red;
  local_118._16_8_ = (_Base_ptr)0x0;
  local_118._24_8_ = local_118 + 8;
  stack0xffffffffffffff10 = (undefined1  [16])0x0;
  local_e0 = (undefined1  [16])0x0;
  local_d0.__d.__r = (duration)0;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x14a;
  file_13.m_begin = (iterator)&local_568;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar6;
  _Stack_148._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_148._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118._32_8_ = local_118._24_8_;
  _Stack_170._M_right = _Stack_170._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_578,
             msg_13);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_248,1);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0, node1)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee566e;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_580 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  local_1d8[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_588,0x14a);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x14b;
  file_14.m_begin = (iterator)&local_598;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5a8,
             msg_14);
  local_1d8[0] = (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_258,1);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p2n1, node1)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee5691;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5b0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_5b8,0x14b);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x14c;
  file_15.m_begin = (iterator)&local_5c8;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5d8,
             msg_15);
  local_1d8[0] = (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_268,2);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p1n1, node2)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee59f9;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5e0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_5e8,0x14c);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x14d;
  file_16.m_begin = (iterator)&local_5f8;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_608,
             msg_16);
  local_1d8[0] = (class_property<bool>)TxOrphanage::AddTx((TxOrphanage *)local_178,&local_278,2);
  local_1d0.px = (element_type *)0x0;
  local_1d0.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "orphanage.AddTx(child_p1n0_p2n0, node2)";
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(element_type *)0xee5a21
  ;
  local_1a8[8] = false;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_198 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_610 = "";
  pvVar6 = (iterator)0x0;
  local_190 = (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar13,
             (size_t)&local_618,0x14d);
  boost::detail::shared_count::~shared_count(&local_1d0.pn);
  local_1d8 = (undefined1  [8])
              local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d0.px = (element_type *)
                 local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  if (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  paVar7 = &local_370;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_1d8;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)local_1a8,__l_05,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar7);
  if (local_1d0.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0.px);
  }
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x15a;
  file_17.m_begin = (iterator)&local_628;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = (iterator)paVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_638,
             msg_17);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_228,1);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromSamePeer(parent1, node1))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_640 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1c0 = (element_type *)local_388;
  local_1f8[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_648,0x15a);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x15b;
  file_18.m_begin = (iterator)&local_658;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_668,
             msg_18);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_228,2);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_1a8,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromDifferentPeer(parent1, node2))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_670 = "";
  pvVar6 = (iterator)0x0;
  local_1c0 = (element_type *)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_678,0x15b);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_1a8);
  local_1d8 = (undefined1  [8])
              local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d0.px = (element_type *)
                 local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  if ((element_type *)
      local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  paVar7 = &local_370;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)local_1d8;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)local_1a8,__l_06,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar7);
  if (local_1d0.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0.px);
  }
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x162;
  file_19.m_begin = (iterator)&local_688;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = (iterator)paVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_698,
             msg_19);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_238,1);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromSamePeer(parent2, node1))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1c0 = (element_type *)local_388;
  local_1f8[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_6a8,0x162);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x163;
  file_20.m_begin = (iterator)&local_6b8;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_6c8,
             msg_20);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_238,2);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_1a8,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromDifferentPeer(parent2, node2))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6d0 = "";
  pvVar6 = (iterator)0x0;
  local_1c0 = (element_type *)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_6d8,0x163);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_1a8);
  local_1d8 = (undefined1  [8])
              local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((element_type *)
      local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_1d0.pn.pi_ =
       (sp_counted_base *)
       local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d0.px = (element_type *)
                 local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  local_1c0 = (element_type *)
              local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if ((element_type *)
      local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  paVar7 = &local_370;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_1d8;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)local_1a8,__l_07,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar7);
  lVar5 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_1e0 + lVar5) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_1e0 + lVar5));
    }
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != 0);
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x16a;
  file_21.m_begin = (iterator)&local_6e8;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = (iterator)paVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_6f8,
             msg_21);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_228,2);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromSamePeer(parent1, node2))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_700 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1c0 = (element_type *)local_388;
  local_1f8[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_708,0x16a);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x16b;
  file_22.m_begin = (iterator)&local_718;
  msg_22.m_end = pvVar8;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_728,
             msg_22);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_228,1);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_1a8,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromDifferentPeer(parent1, node1))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_730 = "";
  pvVar6 = (iterator)0x0;
  local_1c0 = (element_type *)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_738,0x16b);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_1a8);
  local_1d8 = (undefined1  [8])
              local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d0.px = (element_type *)
                 local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  if ((element_type *)
      local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  paVar7 = &local_370;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)local_1d8;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)local_1a8,__l_08,(less<std::shared_ptr<const_CTransaction>_> *)local_1f8,
        (allocator_type *)paVar7);
  if (local_1d0.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0.px);
  }
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x172;
  file_23.m_begin = (iterator)&local_748;
  msg_23.m_end = pvVar6;
  msg_23.m_begin = (iterator)paVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_758,
             msg_23);
  TxOrphanage::GetChildrenFromSamePeer
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_238,2);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_1a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromSamePeer(parent2, node2))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_760 = "";
  pvVar6 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_1c0 = (element_type *)local_388;
  local_1f8[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_768,0x172);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_370);
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x173;
  file_24.m_begin = (iterator)&local_778;
  msg_24.m_end = pvVar8;
  msg_24.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_788,
             msg_24);
  TxOrphanage::GetChildrenFromDifferentPeer
            ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
              *)&local_370,(TxOrphanage *)local_178,&local_238,1);
  local_1f8[0] = (class_property<bool>)
                 EqualTxns((set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_1a8,
                           (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                            *)&local_370);
  stack0xfffffffffffffe10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_388._0_8_ =
       "EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromDifferentPeer(parent2, node1))";
  local_388._8_8_ = "";
  local_1d0.px = (element_type *)(local_1d0._1_8_ << 8);
  local_1d8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_1d0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_790 = "";
  local_1c0 = (element_type *)local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,_cVar13,
             (size_t)&local_798,0x173);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1ef + 7));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)&local_370);
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_1a8);
  if (p_Stack_e8 != (pointer)0x0) {
    operator_delete(p_Stack_e8,local_e0._8_8_ - (long)p_Stack_e8);
  }
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
               *)local_118);
  std::
  _Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
  ::~_Rb_tree(&_Stack_148);
  std::
  _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
  ::~_Rb_tree((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
               *)local_178);
  if ((element_type *)
      local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)
      local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)
      local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,local_208 - local_218._0_8_);
  }
  ChaCha20::~ChaCha20(&local_c0.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(get_children)
{
    FastRandomContext det_rand{true};
    std::vector<COutPoint> empty_outpoints;

    auto parent1 = MakeTransactionSpending(empty_outpoints, det_rand);
    auto parent2 = MakeTransactionSpending(empty_outpoints, det_rand);

    // Make sure these parents have different txids otherwise this test won't make sense.
    while (parent1->GetHash() == parent2->GetHash()) {
        parent2 = MakeTransactionSpending(empty_outpoints, det_rand);
    }

    // Create children to go into orphanage.
    auto child_p1n0 = MakeTransactionSpending({{parent1->GetHash(), 0}}, det_rand);
    auto child_p2n1 = MakeTransactionSpending({{parent2->GetHash(), 1}}, det_rand);
    // Spends the same tx twice. Should not cause duplicates.
    auto child_p1n0_p1n1 = MakeTransactionSpending({{parent1->GetHash(), 0}, {parent1->GetHash(), 1}}, det_rand);
    // Spends the same outpoint as previous tx. Should still be returned; don't assume outpoints are unique.
    auto child_p1n0_p2n0 = MakeTransactionSpending({{parent1->GetHash(), 0}, {parent2->GetHash(), 0}}, det_rand);

    const NodeId node1{1};
    const NodeId node2{2};

    // All orphans provided by node1
    {
        TxOrphanage orphanage;
        BOOST_CHECK(orphanage.AddTx(child_p1n0, node1));
        BOOST_CHECK(orphanage.AddTx(child_p2n1, node1));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p1n1, node1));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p2n0, node1));

        std::set<CTransactionRef> expected_parent1_children{child_p1n0, child_p1n0_p2n0, child_p1n0_p1n1};
        std::set<CTransactionRef> expected_parent2_children{child_p2n1, child_p1n0_p2n0};

        BOOST_CHECK(EqualTxns(expected_parent1_children, orphanage.GetChildrenFromSamePeer(parent1, node1)));
        BOOST_CHECK(EqualTxns(expected_parent2_children, orphanage.GetChildrenFromSamePeer(parent2, node1)));

        BOOST_CHECK(EqualTxns(expected_parent1_children, orphanage.GetChildrenFromDifferentPeer(parent1, node2)));
        BOOST_CHECK(EqualTxns(expected_parent2_children, orphanage.GetChildrenFromDifferentPeer(parent2, node2)));

        // The peer must match
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(parent1, node2).empty());
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(parent2, node2).empty());

        // There shouldn't be any children of this tx in the orphanage
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node1).empty());
        BOOST_CHECK(orphanage.GetChildrenFromSamePeer(child_p1n0_p2n0, node2).empty());
        BOOST_CHECK(orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node1).empty());
        BOOST_CHECK(orphanage.GetChildrenFromDifferentPeer(child_p1n0_p2n0, node2).empty());
    }

    // Orphans provided by node1 and node2
    {
        TxOrphanage orphanage;
        BOOST_CHECK(orphanage.AddTx(child_p1n0, node1));
        BOOST_CHECK(orphanage.AddTx(child_p2n1, node1));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p1n1, node2));
        BOOST_CHECK(orphanage.AddTx(child_p1n0_p2n0, node2));

        // +----------------+---------------+----------------------------------+
        // |                | sender=node1  |           sender=node2           |
        // +----------------+---------------+----------------------------------+
        // | spends parent1 | child_p1n0    | child_p1n0_p1n1, child_p1n0_p2n0 |
        // | spends parent2 | child_p2n1    | child_p1n0_p2n0                  |
        // +----------------+---------------+----------------------------------+

        // Children of parent1 from node1:
        {
            std::set<CTransactionRef> expected_parent1_node1{child_p1n0};

            BOOST_CHECK(EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromSamePeer(parent1, node1)));
            BOOST_CHECK(EqualTxns(expected_parent1_node1, orphanage.GetChildrenFromDifferentPeer(parent1, node2)));
        }

        // Children of parent2 from node1:
        {
            std::set<CTransactionRef> expected_parent2_node1{child_p2n1};

            BOOST_CHECK(EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromSamePeer(parent2, node1)));
            BOOST_CHECK(EqualTxns(expected_parent2_node1, orphanage.GetChildrenFromDifferentPeer(parent2, node2)));
        }

        // Children of parent1 from node2:
        {
            std::set<CTransactionRef> expected_parent1_node2{child_p1n0_p1n1, child_p1n0_p2n0};

            BOOST_CHECK(EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromSamePeer(parent1, node2)));
            BOOST_CHECK(EqualTxns(expected_parent1_node2, orphanage.GetChildrenFromDifferentPeer(parent1, node1)));
        }

        // Children of parent2 from node2:
        {
            std::set<CTransactionRef> expected_parent2_node2{child_p1n0_p2n0};

            BOOST_CHECK(EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromSamePeer(parent2, node2)));
            BOOST_CHECK(EqualTxns(expected_parent2_node2, orphanage.GetChildrenFromDifferentPeer(parent2, node1)));
        }
    }
}